

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O3

UChar * u_memrchr32_63(UChar *s,UChar32 c,int32_t count)

{
  UChar *pUVar1;
  long lVar2;
  
  if ((uint)c < 0x10000) {
    pUVar1 = u_memrchr_63(s,(UChar)c,count);
    return pUVar1;
  }
  if ((uint)c < 0x110000 && 1 < count) {
    lVar2 = (ulong)(uint)count * 2;
    while (((c & 0x3ffU | 0xdc00) != (uint)*(ushort *)((long)s + lVar2 + -2) ||
           (((uint)c >> 10) + 0xd7c0 != (uint)*(ushort *)((long)s + lVar2 + -4)))) {
      lVar2 = lVar2 + -2;
      if (lVar2 == 2) {
        return (UChar *)0x0;
      }
    }
    return (UChar *)((long)s + lVar2 + -4);
  }
  return (UChar *)0x0;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_memrchr32(const UChar *s, UChar32 c, int32_t count) {
    if((uint32_t)c<=U_BMP_MAX) {
        /* find BMP code point */
        return u_memrchr(s, (UChar)c, count);
    } else if(count<2) {
        /* too short for a surrogate pair */
        return NULL;
    } else if((uint32_t)c<=UCHAR_MAX_VALUE) {
        /* find supplementary code point as surrogate pair */
        const UChar *limit=s+count-1;
        UChar lead=U16_LEAD(c), trail=U16_TRAIL(c);

        do {
            if(*limit==trail && *(limit-1)==lead) {
                return (UChar *)(limit-1);
            }
        } while(s!=--limit);
        return NULL;
    } else {
        /* not a Unicode code point, not findable */
        return NULL;
    }
}